

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O0

bool wallet::IsBDBFile(path *path)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  path *in_RDI;
  long in_FS_OFFSET;
  uintmax_t size;
  uint32_t data;
  error_code ec;
  ifstream file;
  undefined4 in_stack_fffffffffffffd08;
  undefined4 uVar5;
  openmode in_stack_fffffffffffffd0c;
  char *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  error_code *in_stack_fffffffffffffd20;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffd28;
  bool local_2c1;
  bool local_285;
  int in_stack_fffffffffffffd7c;
  int iVar6;
  error_code local_260;
  char local_250 [8];
  ConstevalFormatString<3U> in_stack_fffffffffffffdb8;
  string_view in_stack_fffffffffffffdc0;
  string_view in_stack_fffffffffffffdd0;
  Level in_stack_fffffffffffffeb0;
  char (*in_stack_fffffffffffffec0) [10];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = fs::exists((path *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
  if (bVar2) {
    std::error_code::error_code
              ((error_code *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    uVar4 = std::filesystem::file_size(in_RDI,&local_260);
    bVar2 = std::error_code::operator_cast_to_bool
                      ((error_code *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
    if (bVar2) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_fffffffffffffd28,(char *)in_stack_fffffffffffffd20);
      std::error_code::message_abi_cxx11_(in_stack_fffffffffffffd20);
      fs::PathToString_abi_cxx11_((path *)in_stack_fffffffffffffd10);
      in_stack_fffffffffffffd18 = "IsBDBFile";
      in_stack_fffffffffffffd10 = "%s: %s %s\n";
      uVar5 = 2;
      LogPrintFormatInternal<char[10],std::__cxx11::string,std::__cxx11::string>
                (in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc0,in_stack_fffffffffffffd7c,
                 (LogFlags)in_RDI,in_stack_fffffffffffffeb0,in_stack_fffffffffffffdb8,
                 in_stack_fffffffffffffec0,in_stack_fffffffffffffec8,in_stack_fffffffffffffed0);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,uVar5));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,uVar5));
    }
    if (uVar4 < 0x1000) {
      local_285 = false;
    }
    else {
      std::ifstream::ifstream<fs::path,fs::path>
                ((basic_ifstream<char,_std::char_traits<char>_> *)in_stack_fffffffffffffd18,
                 (path *)in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
      bVar3 = std::ifstream::is_open();
      if ((bVar3 & 1) == 0) {
        local_285 = false;
      }
      else {
        std::istream::seekg((long)local_250,0xc);
        iVar6 = 0;
        std::istream::read(local_250,(long)&stack0xfffffffffffffd7c);
        local_2c1 = iVar6 == 0x53162 || iVar6 == 0x62310500;
        local_285 = local_2c1;
      }
      std::ifstream::~ifstream(local_250);
    }
  }
  else {
    local_285 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_285;
  }
  __stack_chk_fail();
}

Assistant:

bool IsBDBFile(const fs::path& path)
{
    if (!fs::exists(path)) return false;

    // A Berkeley DB Btree file has at least 4K.
    // This check also prevents opening lock files.
    std::error_code ec;
    auto size = fs::file_size(path, ec);
    if (ec) LogPrintf("%s: %s %s\n", __func__, ec.message(), fs::PathToString(path));
    if (size < 4096) return false;

    std::ifstream file{path, std::ios::binary};
    if (!file.is_open()) return false;

    file.seekg(12, std::ios::beg); // Magic bytes start at offset 12
    uint32_t data = 0;
    file.read((char*) &data, sizeof(data)); // Read 4 bytes of file to compare against magic

    // Berkeley DB Btree magic bytes, from:
    //  https://github.com/file/file/blob/5824af38469ec1ca9ac3ffd251e7afe9dc11e227/magic/Magdir/database#L74-L75
    //  - big endian systems - 00 05 31 62
    //  - little endian systems - 62 31 05 00
    return data == 0x00053162 || data == 0x62310500;
}